

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

uint * getRevealedMerkleNodes
                 (tree_t *tree,uint16_t *missingLeaves,size_t missingLeavesSize,size_t *outputSize)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  bitset_word_t *array;
  bitset_word_t bVar4;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uint node;
  uint i_2;
  uint pos;
  uint *revealed;
  uint i_1;
  size_t i;
  bitset_word_t *missingNodes;
  uint firstLeaf;
  tree_t *in_stack_ffffffffffffff98;
  bitset_word_t *array_00;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_44;
  ulong local_40;
  uint *local_8;
  
  if ((in_RSI == 0) && (in_RDX != 0)) {
    local_8 = (uint *)0x0;
  }
  else {
    iVar2 = *(int *)(in_RDI + 0x18) - *(int *)(in_RDI + 0x1c);
    array = (bitset_word_t *)calloc((ulong)*(uint *)(in_RDI + 0x18) + 0x3f >> 6,8);
    if (array == (bitset_word_t *)0x0) {
      local_8 = (uint *)0x0;
    }
    else {
      for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
        set_bit(array,(ulong)(iVar2 + (uint)*(ushort *)(in_RSI + local_40 * 2)));
      }
      for (local_44 = getParent(*(int *)(in_RDI + 0x18) - 1); local_44 != 0; local_44 = local_44 - 1
          ) {
        bVar4 = exists(in_stack_ffffffffffffff98,0);
        if (bVar4 != 0) {
          bVar4 = exists(in_stack_ffffffffffffff98,0);
          if (bVar4 == 0) {
            bVar4 = get_bit(array,(ulong)(local_44 * 2 + 1));
            if (bVar4 != 0) {
              set_bit(array,(ulong)local_44);
            }
          }
          else {
            bVar4 = get_bit(array,(ulong)(local_44 * 2 + 1));
            if ((bVar4 != 0) && (bVar4 = get_bit(array,(ulong)(local_44 * 2 + 2)), bVar4 != 0)) {
              set_bit(array,(ulong)local_44);
            }
          }
        }
      }
      local_8 = (uint *)malloc((ulong)*(uint *)(in_RDI + 0x1c) << 2);
      if (local_8 == (uint *)0x0) {
        free(array);
        local_8 = (uint *)0x0;
      }
      else {
        local_54 = 0;
        for (local_58 = 0; local_58 < in_RDX; local_58 = local_58 + 1) {
          local_5c = (uint)*(ushort *)(in_RSI + (ulong)local_58 * 2) + iVar2;
          do {
            array_00 = array;
            uVar3 = getParent(local_5c);
            bVar4 = get_bit(array_00,(ulong)uVar3);
            if (bVar4 == 0) {
              _Var1 = contains(local_8,(ulong)local_54,local_5c);
              if (!_Var1) {
                local_8[local_54] = local_5c;
                local_54 = local_54 + 1;
              }
              break;
            }
            local_5c = getParent(local_5c);
          } while (local_5c != 0);
        }
        free(array);
        *in_RCX = (ulong)local_54;
      }
    }
  }
  return local_8;
}

Assistant:

static unsigned int* getRevealedMerkleNodes(const tree_t* tree, uint16_t* missingLeaves,
                                            size_t missingLeavesSize, size_t* outputSize) {
  if (!missingLeaves && missingLeavesSize) {
    return NULL;
  }

  const unsigned int firstLeaf = tree->numNodes - tree->numLeaves;
  bitset_word_t* missingNodes =
      calloc((tree->numNodes + sizeof(bitset_word_t) * 8 - 1) / (sizeof(bitset_word_t) * 8),
             sizeof(bitset_word_t));
  if (!missingNodes) {
    return NULL;
  }

  /* Mark leaves that are missing */
  for (size_t i = 0; i < missingLeavesSize; i++) {
    set_bit(missingNodes, firstLeaf + missingLeaves[i]);
  }

  /* For the nonleaf nodes, if both leaves are missing, mark it as missing too */
  for (unsigned int i = getParent(tree->numNodes - 1); i > 0; i--) {
    if (!exists(tree, i)) {
      continue;
    }
    if (exists(tree, 2 * i + 2)) {
      if (get_bit(missingNodes, 2 * i + 1) && get_bit(missingNodes, 2 * i + 2)) {
        set_bit(missingNodes, i);
      }
    } else {
      if (get_bit(missingNodes, 2 * i + 1)) {
        set_bit(missingNodes, i);
      }
    }
  }

  /* For each missing leaf node, add the highest missing node on the path
   * back to the root to the set to be revealed */
  unsigned int* revealed = malloc(tree->numLeaves * sizeof(unsigned int));
  if (!revealed) {
    free(missingNodes);
    return NULL;
  }

  unsigned int pos = 0;
  for (unsigned int i = 0; i < missingLeavesSize; i++) {
    /* input is leaf indexes, translate to nodes */
    unsigned int node = missingLeaves[i] + firstLeaf;
    do {
      if (!get_bit(missingNodes, getParent(node))) {
        if (!contains(revealed, pos, node)) {
          revealed[pos] = node;
          pos++;
        }
        break;
      }
    } while ((node = getParent(node)) != 0);
  }

  free(missingNodes);
  *outputSize = pos;
  return revealed;
}